

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O2

tool_t * create_tool(char *tool_name)

{
  uint uVar1;
  uint uVar2;
  tool_t *new_tool;
  char *__format;
  FILE *pFVar3;
  undefined8 uStackY_30;
  
  pFVar3 = _stderr;
  if (0 < debug_level) {
    uVar1 = gotcha_gettid();
    uVar2 = getpid();
    fprintf(pFVar3,"[%d/%d][%s:%u] - Found no existing tool with name %s\n",(ulong)uVar1,
            (ulong)uVar2,"tool.c",0x41,tool_name);
  }
  new_tool = (tool_t *)malloc(0x58);
  pFVar3 = _stderr;
  if (new_tool == (tool_t *)0x0) {
    if (debug_level == 0) {
      return (tool_t *)0x0;
    }
    uVar1 = gotcha_gettid();
    uVar2 = getpid();
    __format = "ERROR [%d/%d][%s:%u] - Failed to malloc tool %s\n";
    uStackY_30 = 0x45;
  }
  else {
    new_tool->tool_name = tool_name;
    new_tool->binding = (binding_t *)0x0;
    (new_tool->config).priority = -1;
    reorder_tool(new_tool);
    new_tool->parent_tool = (tool_t *)0x0;
    create_hashtable(&new_tool->child_tools,0x18,strhash,strcmp);
    pFVar3 = _stderr;
    if (debug_level < 1) {
      return new_tool;
    }
    uVar1 = gotcha_gettid();
    uVar2 = getpid();
    __format = "[%d/%d][%s:%u] - Created new tool %s\n";
    uStackY_30 = 0x51;
  }
  fprintf(pFVar3,__format,(ulong)uVar1,(ulong)uVar2,"tool.c",uStackY_30,tool_name);
  return new_tool;
}

Assistant:

tool_t *create_tool(const char *tool_name) {
  debug_printf(1, "Found no existing tool with name %s\n", tool_name);
  // TODO: ensure free
  tool_t *newtool = (tool_t *)gotcha_malloc(sizeof(tool_t));
  if (!newtool) {
    error_printf("Failed to malloc tool %s\n", tool_name);  // GCOVR_EXCL_LINE
    return NULL;                                            // GCOVR_EXCL_LINE
  }
  newtool->tool_name = tool_name;
  newtool->binding = NULL;
  // newtool->next_tool = tools;
  newtool->config = get_default_configuration();
  reorder_tool(newtool);
  newtool->parent_tool = NULL;
  create_hashtable(&newtool->child_tools, 24, (hash_func_t)strhash,
                   (hash_cmp_t)gotcha_strcmp);
  // tools = newtool;
  debug_printf(1, "Created new tool %s\n", tool_name);
  return newtool;
}